

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O2

Reals Omega_h::diffuse_integrals_weighted
                (Mesh *mesh,Graph *g,Reals *error_integrals,Reals *quantity_integrals,
                VarCompareOpts opts,string *name,bool verbose)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this;
  Alloc *pAVar1;
  char cVar2;
  LO b;
  int iVar3;
  I32 IVar4;
  ostream *poVar5;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar6;
  int comp;
  Write<double> *pWVar7;
  undefined7 in_register_00000089;
  size_t sVar8;
  Reals RVar9;
  byte in_stack_00000020;
  Read<double> comp_quantity_integrals;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> comp_name;
  Read<double> comp_integrals;
  Write<double> out;
  Read<double> weighted_sizes;
  Reals weighted_densities;
  undefined1 local_298 [32];
  string local_278;
  Write<double> local_258;
  Write<double> local_248;
  uint local_234;
  Write<double> local_230;
  Write<double> *local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_218;
  Write<double> local_210;
  Write<double> local_200;
  undefined1 local_1f0 [64];
  Write<double> local_1b0;
  Write<double> local_1a0;
  Write<double> local_190;
  Write<double> local_180;
  Write<double> local_170;
  Write<signed_char> local_160;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_150;
  Write<double> local_140;
  Write<double> local_130;
  string local_120;
  Graph local_100;
  Write<signed_char> local_e0;
  Write<double> local_d0;
  Write<double> local_c0;
  Write<double> local_b0;
  string local_a0;
  Write<double> local_80;
  Write<double> local_70;
  Write<double> local_60;
  Graph local_50;
  
  local_218 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT71(in_register_00000089,verbose);
  local_298._16_8_ = mesh;
  local_298._24_8_ = g;
  if (opts.type == NONE) {
    Write<double>::Write((Write<signed_char> *)mesh,(Write<signed_char> *)quantity_integrals);
    pvVar6 = extraout_RDX;
  }
  else {
    pAVar1 = (quantity_integrals->write_).shared_alloc_.alloc;
    if (((ulong)pAVar1 & 1) == 0) {
      sVar8 = pAVar1->size;
    }
    else {
      sVar8 = (ulong)pAVar1 >> 3;
    }
    b = Graph::nnodes((Graph *)error_integrals);
    iVar3 = divide_no_remainder<int>((int)(sVar8 >> 3),b);
    local_220 = &quantity_integrals->write_;
    if (iVar3 < 2) {
      Write<double>::Write(&local_d0,(Write<double> *)name);
      fabs_each((Omega_h *)&local_230,(Read<double> *)&local_d0);
      Write<double>::~Write(&local_d0);
      Write<double>::Write(&local_170,&local_230);
      each_max_with<double>((Omega_h *)&local_278,(Read<double> *)&local_170,opts.floor);
      Write<double>::operator=(&local_230,(Write<signed_char> *)&local_278);
      Write<double>::~Write((Write<double> *)&local_278);
      Write<double>::~Write(&local_170);
      Write<double>::Write(&local_180,&quantity_integrals->write_);
      Write<double>::Write(&local_190,&local_230);
      divide_each_maybe_zero((Omega_h *)&local_200,(Reals *)&local_180,(Reals *)&local_190);
      Write<double>::~Write(&local_190);
      Write<double>::~Write(&local_180);
      Graph::Graph(&local_100,(Graph *)error_integrals);
      Write<double>::Write(&local_210,&local_200);
      Write<double>::Write(&local_1a0,&local_230);
      Mesh::comm((Mesh *)local_298);
      iVar3 = 0;
      while( true ) {
        std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_150,(__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> *)local_298);
        Write<double>::Write(&local_60,&local_210);
        std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> *)local_1f0,&local_150);
        Write<double>::Write(&local_258,&local_60);
        fabs_each((Omega_h *)&local_248,(Read<double> *)&local_258);
        each_leq_to<double>((Omega_h *)&local_120,(Read<double> *)&local_248,opts.tolerance);
        cVar2 = get_min<signed_char>((CommPtr *)local_1f0,(Read<signed_char> *)&local_120);
        Write<signed_char>::~Write((Write<signed_char> *)&local_120);
        Write<double>::~Write(&local_248);
        Write<double>::~Write(&local_258);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f0 + 8));
        Write<double>::~Write(&local_60);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_150._M_refcount);
        if (cVar2 != '\0') break;
        Graph::Graph((Graph *)&local_278,&local_100);
        Write<double>::Write(&local_70,&local_210);
        Write<double>::Write(&local_80,&local_1a0);
        diffuse_densities_once
                  ((Omega_h *)local_1f0,(Mesh *)local_298._24_8_,(Graph *)&local_278,
                   (Reals *)&local_70,(Reals *)&local_80);
        Write<double>::operator=(&local_210,(Write<signed_char> *)local_1f0);
        Write<double>::~Write((Write<double> *)local_1f0);
        Write<double>::~Write(&local_80);
        Write<double>::~Write(&local_70);
        Graph::~Graph((Graph *)&local_278);
        iVar3 = iVar3 + 1;
      }
      if (in_stack_00000020 != 0) {
        IVar4 = Comm::rank((Comm *)local_298._0_8_);
        if (IVar4 == 0) {
          poVar5 = std::operator<<((ostream *)&std::cout,"diffused ");
          poVar5 = std::operator<<(poVar5,(string *)local_218);
          poVar5 = std::operator<<(poVar5," in ");
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar3);
          std::operator<<(poVar5," iterations\n");
        }
      }
      Write<double>::Write(&local_e0,(Write<signed_char> *)&local_210);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_298 + 8));
      Write<double>::operator=(&local_200,&local_e0);
      Write<double>::~Write((Write<double> *)&local_e0);
      Write<double>::~Write(&local_1a0);
      Write<double>::~Write(&local_210);
      Graph::~Graph(&local_100);
      Write<double>::Write((Write<double> *)(local_1f0 + 0x30),&local_200);
      Write<double>::Write((Write<double> *)(local_1f0 + 0x20),&local_230);
      pWVar7 = local_220;
      std::__cxx11::string::string((string *)&local_278,"",(allocator *)&local_120);
      multiply_each<double>
                ((Omega_h *)&local_1b0,(Read<double> *)(local_1f0 + 0x30),
                 (Read<double> *)(local_1f0 + 0x20),&local_278);
      Read<double>::Read((Read<signed_char> *)local_1f0,&local_1b0);
      Write<double>::operator=(pWVar7,(Write<signed_char> *)local_1f0);
      Write<double>::~Write((Write<double> *)local_1f0);
      Write<double>::~Write(&local_1b0);
      std::__cxx11::string::~string((string *)&local_278);
      Write<double>::~Write((Write<double> *)(local_1f0 + 0x20));
      Write<double>::~Write((Write<double> *)(local_1f0 + 0x30));
      Write<double>::Write((Write<signed_char> *)local_298._16_8_,(Write<signed_char> *)pWVar7);
      Write<double>::~Write(&local_200);
      pWVar7 = &local_230;
    }
    else {
      pAVar1 = (quantity_integrals->write_).shared_alloc_.alloc;
      if (((ulong)pAVar1 & 1) == 0) {
        sVar8 = pAVar1->size;
      }
      else {
        sVar8 = (ulong)pAVar1 >> 3;
      }
      std::__cxx11::string::string((string *)&local_278,"",(allocator *)local_1f0);
      Write<double>::Write(&local_248,(LO)(sVar8 >> 3),&local_278);
      std::__cxx11::string::~string((string *)&local_278);
      local_234 = (uint)in_stack_00000020;
      for (comp = 0; iVar3 != comp; comp = comp + 1) {
        Write<double>::Write(&local_130,local_220);
        get_component<double>((Omega_h *)&local_258,(Read<double> *)&local_130,iVar3,comp);
        Write<double>::~Write(&local_130);
        this = &local_a0.field_2;
        Write<double>::Write((Write<double> *)this,(Write<double> *)name);
        get_component<double>((Omega_h *)local_298,(Read<double> *)this,iVar3,comp);
        Write<double>::~Write((Write<double> *)this);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f0,local_218,"_");
        std::__cxx11::to_string(&local_120,comp);
        std::operator+(&local_278,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f0,&local_120);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)local_1f0);
        Graph::Graph(&local_50,(Graph *)error_integrals);
        Write<double>::Write(&local_140,&local_258);
        Write<double>::Write((Write<double> *)&local_a0,(Write<double> *)local_298);
        diffuse_integrals_weighted
                  ((Mesh *)local_1f0,(Graph *)local_298._24_8_,(Reals *)&local_50,
                   (Reals *)&local_140,opts,&local_a0,SUB81(&local_278,0));
        Write<double>::operator=(&local_258,(Write<signed_char> *)local_1f0);
        Write<double>::~Write((Write<double> *)local_1f0);
        Write<double>::~Write((Write<double> *)&local_a0);
        Write<double>::~Write(&local_140);
        Graph::~Graph(&local_50);
        Write<double>::Write(&local_b0,&local_248);
        Write<double>::Write(&local_c0,&local_258);
        set_component<double>(&local_b0,(Read<double> *)&local_c0,iVar3,comp);
        Write<double>::~Write(&local_c0);
        Write<double>::~Write(&local_b0);
        std::__cxx11::string::~string((string *)&local_278);
        Write<double>::~Write((Write<double> *)local_298);
        Write<double>::~Write(&local_258);
      }
      Write<double>::Write(&local_160,(Write<signed_char> *)&local_248);
      Read<double>::Read((Read<signed_char> *)local_298._16_8_,(Write<double> *)&local_160);
      Write<double>::~Write((Write<double> *)&local_160);
      pWVar7 = &local_248;
    }
    Write<double>::~Write(pWVar7);
    pvVar6 = extraout_RDX_00;
  }
  RVar9.write_.shared_alloc_.direct_ptr = pvVar6;
  RVar9.write_.shared_alloc_.alloc = (Alloc *)local_298._16_8_;
  return (Reals)RVar9.write_.shared_alloc_;
}

Assistant:

static Reals diffuse_integrals_weighted(Mesh* mesh, Graph g,
    Reals error_integrals, Reals quantity_integrals, VarCompareOpts opts,
    std::string const& name, bool verbose) {
  if (opts.type == VarCompareOpts::NONE) return error_integrals;
  auto ncomps = divide_no_remainder(error_integrals.size(), g.nnodes());
  if (ncomps > 1) {
    Write<Real> out(error_integrals.size());
    for (Int c = 0; c < ncomps; ++c) {
      auto comp_integrals = get_component(error_integrals, ncomps, c);
      auto comp_quantity_integrals =
          get_component(quantity_integrals, ncomps, c);
      auto comp_name = name + "_" + std::to_string(c);
      comp_integrals = diffuse_integrals_weighted(mesh, g, comp_integrals,
          comp_quantity_integrals, opts, comp_name, verbose);
      set_component(out, comp_integrals, ncomps, c);
    }
    return out;
  }
  auto weighted_sizes = fabs_each(quantity_integrals);
  weighted_sizes = each_max_with(weighted_sizes, opts.floor);
  auto weighted_densities =
      divide_each_maybe_zero(error_integrals, weighted_sizes);
  weighted_densities = diffuse_densities(
      mesh, g, weighted_densities, weighted_sizes, opts, name, verbose);
  error_integrals = multiply_each(weighted_densities, weighted_sizes);
  return error_integrals;
}